

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

get_result * __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_internal(get_result *__return_storage_ptr__,
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *this,art_key_type k)

{
  undefined8 uVar1;
  _Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> local_78;
  undefined1 local_58 [8];
  try_get_result_type result;
  
  result.super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._M_payload.
  _M_value.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
  super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
  super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged = false;
  result.super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>._24_8_ =
       __return_storage_ptr__;
  do {
    try_get((try_get_result_type *)&local_78,this,k);
    std::_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::
    _M_move_assign((_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *
                   )local_58,&local_78);
    std::_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::_M_reset
              (&local_78);
    uVar1 = result.
            super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
            .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
            _24_8_;
  } while (result.
           super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
           .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
           _M_payload._M_value.
           super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
           super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
           super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged != true);
  std::_Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>::_Optional_base
            ((_Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false> *)
             result.
             super__Optional_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>,_true,_false,_false>
             .super__Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>.
             _24_8_,(_Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false> *)local_58)
  ;
  std::_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_>::_M_reset
            ((_Optional_payload_base<std::optional<unodb::qsbr_ptr_span<const_std::byte>_>_> *)
             local_58);
  return (get_result *)uVar1;
}

Assistant:

typename olc_db<Key, Value>::get_result olc_db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  try_get_result_type result;

  while (true) {
    result = try_get(k);
    if (result) break;
    // TODO(laurynas): upgrade to write locks to prevent starving after a
    // certain number of failures?
  }

  return *result;
}